

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_common.h
# Opt level: O1

void get_txb_ctx(BLOCK_SIZE plane_bsize,TX_SIZE tx_size,int plane,ENTROPY_CONTEXT *a,
                ENTROPY_CONTEXT *l,TXB_CTX *txb_ctx)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined7 in_register_00000031;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  switch(CONCAT71(in_register_00000031,tx_size) & 0xffffffff) {
  case 0:
    txb_ctx->dc_sign_ctx =
         (int)(char)get_txb_ctx_general_dc_sign_contexts
                    [(long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)*l >> 3)) +
                     (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)*a >> 3)) +
                     0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_4X4) {
        uVar13 = (uint)(*a & 7U);
        if (3 < (*a & 7U)) {
          uVar13 = 4;
        }
        uVar15 = 4;
        if ((*l & 7U) < 4) {
          uVar15 = (uint)(*l & 7U);
        }
        uVar19 = (ulong)uVar13;
        uVar16 = (ulong)uVar15;
LAB_00244495:
        uVar13 = (uint)(byte)get_txb_ctx_general_skip_contexts[uVar16 + uVar19 * 5];
        goto LAB_00244577;
      }
LAB_00244454:
      uVar13 = 0;
      goto LAB_00244577;
    }
    iVar11 = ((uint)(plane_bsize != BLOCK_4X4) * 3 + 1) - (uint)(*a == '\0');
    bVar22 = *l == '\0';
    break;
  case 1:
    lVar18 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)(uint)((int)uVar16 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar18] >> 3)));
      lVar18 = lVar18 + 1;
    } while (lVar18 == 1);
    lVar18 = 0;
    do {
      uVar16 = (long)(int)uVar16 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar18] >> 3));
      lVar18 = lVar18 + 1;
    } while (lVar18 == 1);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar16 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_8X8) {
        bVar10 = (byte)((ushort)*(undefined2 *)a >> 8) | (byte)*(undefined2 *)a;
        bVar14 = (byte)((ushort)*(undefined2 *)l >> 8) | (byte)*(undefined2 *)l;
LAB_0024440c:
        uVar13 = (uint)(bVar10 & 7);
        if (3 < (bVar10 & 7)) {
          uVar13 = 4;
        }
        uVar15 = 4;
        if ((bVar14 & 7) < 4) {
          uVar15 = (uint)(bVar14 & 7);
        }
        uVar13 = (uint)(byte)get_txb_ctx_general_skip_contexts[(ulong)uVar15 + (ulong)uVar13 * 5];
        goto LAB_00244577;
      }
      goto LAB_00244454;
    }
    iVar11 = ((uint)((0x3cfff0UL >> ((ulong)plane_bsize & 0x3f) & 1) != 0) * 3 + 1) -
             (uint)(*(short *)a == 0);
    bVar22 = *(short *)l == 0;
    break;
  case 2:
    lVar18 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)(uint)((int)uVar16 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar18] >> 3)));
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    lVar18 = 0;
    do {
      uVar16 = (long)(int)uVar16 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar18] >> 3));
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar16 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_16X16) {
        uVar13 = *(uint *)a >> 0x10 | *(uint *)a;
        bVar10 = (byte)(uVar13 >> 8) | (byte)uVar13;
        uVar13 = *(uint *)l >> 0x10 | *(uint *)l;
        bVar14 = (byte)(uVar13 >> 8) | (byte)uVar13;
        goto LAB_0024440c;
      }
      goto LAB_00244454;
    }
    iVar11 = ((uint)((0x30ff80UL >> ((ulong)plane_bsize & 0x3f) & 1) != 0) * 3 + 1) -
             (uint)(*(int *)a == 0);
    bVar22 = *(int *)l == 0;
    break;
  case 3:
    lVar18 = 0;
    uVar16 = 0;
    do {
      uVar16 = (ulong)(uint)((int)uVar16 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[lVar18] >> 3)));
      lVar18 = lVar18 + 1;
    } while (lVar18 != 8);
    lVar18 = 0;
    do {
      uVar16 = (long)(int)uVar16 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[lVar18] >> 3));
      lVar18 = lVar18 + 1;
    } while (lVar18 != 8);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar16 + 0x20];
    if (plane == 0) {
      if (plane_bsize != BLOCK_32X32) {
        lVar18 = 0;
        auVar26 = (undefined1  [16])0x0;
        do {
          uVar1 = *(undefined4 *)(a + lVar18);
          uVar16 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
          auVar2._8_4_ = 0;
          auVar2._0_8_ = uVar16;
          auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
          auVar3[8] = (char)((uint)uVar1 >> 0x10);
          auVar3._0_8_ = uVar16;
          auVar3[9] = 0;
          auVar3._10_3_ = auVar2._10_3_;
          auVar8._5_8_ = 0;
          auVar8._0_5_ = auVar3._8_5_;
          auVar27._0_4_ = (undefined4)uVar16;
          auVar4[4] = (char)((uint)uVar1 >> 8);
          auVar4._0_4_ = auVar27._0_4_;
          auVar4[5] = 0;
          auVar4._6_7_ = SUB137(auVar8 << 0x40,6);
          auVar27._4_9_ = auVar4._4_9_;
          auVar27._13_3_ = 0;
          auVar26 = auVar26 | auVar27;
          lVar18 = lVar18 + 4;
        } while (lVar18 != 8);
        auVar24._0_8_ = auVar26._8_8_;
        auVar24._8_4_ = auVar26._8_4_;
        auVar24._12_4_ = auVar26._12_4_;
        lVar18 = 0;
        auVar27 = (undefined1  [16])0x0;
        do {
          uVar1 = *(undefined4 *)(l + lVar18);
          uVar16 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = uVar16;
          auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
          auVar6[8] = (char)((uint)uVar1 >> 0x10);
          auVar6._0_8_ = uVar16;
          auVar6[9] = 0;
          auVar6._10_3_ = auVar5._10_3_;
          auVar9._5_8_ = 0;
          auVar9._0_5_ = auVar6._8_5_;
          auVar28._0_4_ = (undefined4)uVar16;
          auVar7[4] = (char)((uint)uVar1 >> 8);
          auVar7._0_4_ = auVar28._0_4_;
          auVar7[5] = 0;
          auVar7._6_7_ = SUB137(auVar9 << 0x40,6);
          auVar28._4_9_ = auVar7._4_9_;
          auVar28._13_3_ = 0;
          auVar27 = auVar27 | auVar28;
          lVar18 = lVar18 + 4;
        } while (lVar18 != 8);
        auVar25._0_8_ = auVar27._8_8_;
        auVar25._8_4_ = auVar27._8_4_;
        auVar25._12_4_ = auVar27._12_4_;
        uVar15 = SUB164(auVar25 | auVar27,4) | SUB164(auVar25 | auVar27,0);
        uVar12 = (SUB164(auVar24 | auVar26,4) | SUB164(auVar24 | auVar26,0)) & 7;
        if (3 < uVar12) {
          uVar12 = 4;
        }
LAB_00244492:
        uVar19 = (ulong)uVar12;
        uVar16 = (ulong)(uVar15 & 7);
        if (3 < (uVar15 & 7)) {
          uVar16 = 4;
        }
        goto LAB_00244495;
      }
      goto LAB_00244454;
    }
    iVar11 = ((uint)((ulong)plane_bsize - 10 < 6) * 3 + 1) - (uint)(*(long *)a == 0);
    bVar22 = *(long *)l == 0;
    break;
  default:
    uVar16 = (ulong)tx_size;
    uVar13 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
    uVar19 = 1;
    if (1 < (int)uVar13) {
      uVar19 = (ulong)uVar13;
    }
    uVar13 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
    uVar20 = 0;
    uVar17 = 0;
    do {
      uVar17 = (ulong)(uint)((int)uVar17 +
                            (int)*(char *)((long)&get_txb_ctx_general_signs +
                                          (ulong)((byte)a[uVar20] >> 3)));
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
    uVar20 = 1;
    if (1 < (int)uVar13) {
      uVar20 = (ulong)uVar13;
    }
    uVar21 = 0;
    do {
      uVar17 = (long)(int)uVar17 +
               (long)*(char *)((long)&get_txb_ctx_general_signs + (ulong)((byte)l[uVar21] >> 3));
      uVar21 = uVar21 + 1;
    } while (uVar20 != uVar21);
    txb_ctx->dc_sign_ctx = (int)(char)get_txb_ctx_general_dc_sign_contexts[uVar17 + 0x20];
    if (plane == 0) {
      if (txsize_to_bsize[uVar16] != plane_bsize) {
        uVar16 = 0;
        uVar13 = 0;
        do {
          uVar13 = uVar13 | (byte)a[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar19 != uVar16);
        uVar16 = 0;
        uVar15 = 0;
        do {
          uVar15 = uVar15 | (byte)l[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar20 != uVar16);
        uVar12 = uVar13 & 7;
        if (3 < (uVar13 & 7)) {
          uVar12 = 4;
        }
        goto LAB_00244492;
      }
      goto LAB_00244454;
    }
    switch(uVar16) {
    case 0:
      bVar22 = *a == '\0';
      goto LAB_00244518;
    case 1:
      bVar22 = *(short *)a == 0;
      goto LAB_0024453a;
    case 2:
      bVar22 = *(int *)a == 0;
      break;
    case 3:
      bVar22 = *(long *)a == 0;
      goto LAB_002444e6;
    case 4:
      bVar22 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      goto LAB_002444fe;
    case 5:
      bVar22 = *a == '\0';
      goto LAB_0024453a;
    case 6:
      bVar22 = *(short *)a == 0;
      goto LAB_00244518;
    case 7:
      bVar22 = *(short *)a == 0;
      break;
    case 8:
      bVar22 = *(int *)a == 0;
      goto LAB_0024453a;
    case 9:
      bVar22 = *(int *)a == 0;
      goto LAB_002444e6;
    case 10:
      bVar22 = *(long *)a == 0;
      break;
    case 0xb:
      bVar22 = *(long *)a == 0;
      goto LAB_002444fe;
    case 0xc:
      bVar22 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      goto LAB_002444e6;
    case 0xd:
      bVar22 = *a == '\0';
      break;
    case 0xe:
      bVar22 = *(int *)a == 0;
LAB_00244518:
      bVar22 = !bVar22;
      bVar23 = *l == '\0';
      goto LAB_00244542;
    case 0xf:
      bVar22 = *(short *)a == 0;
LAB_002444e6:
      bVar22 = !bVar22;
      bVar23 = *(long *)l == 0;
      goto LAB_00244542;
    case 0x10:
      bVar22 = *(long *)a == 0;
LAB_0024453a:
      bVar22 = !bVar22;
      bVar23 = *(short *)l == 0;
      goto LAB_00244542;
    case 0x11:
      bVar22 = *(int *)a == 0;
LAB_002444fe:
      bVar22 = !bVar22;
      bVar23 = *(long *)(l + 8) == 0 && *(long *)l == 0;
      goto LAB_00244542;
    case 0x12:
      bVar22 = *(long *)(a + 8) == 0 && *(long *)a == 0;
      break;
    default:
      bVar22 = false;
      bVar23 = false;
      goto LAB_00244545;
    }
    bVar22 = !bVar22;
    bVar23 = *(int *)l == 0;
LAB_00244542:
    bVar23 = !bVar23;
LAB_00244545:
    uVar13 = (uint)("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                    [txsize_to_bsize[uVar16]] <
                   "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[plane_bsize]) * 3 +
             (uint)bVar23 + (uint)bVar22 + 7;
    goto LAB_00244577;
  }
  uVar13 = (iVar11 - (uint)bVar22) + 8;
LAB_00244577:
  txb_ctx->txb_skip_ctx = uVar13;
  return;
}

Assistant:

static inline void get_txb_ctx(const BLOCK_SIZE plane_bsize,
                               const TX_SIZE tx_size, const int plane,
                               const ENTROPY_CONTEXT *const a,
                               const ENTROPY_CONTEXT *const l,
                               TXB_CTX *const txb_ctx) {
  switch (tx_size) {
    case TX_4X4: get_txb_ctx_4x4(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_8X8: get_txb_ctx_8x8(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_16X16: get_txb_ctx_16x16(plane_bsize, plane, a, l, txb_ctx); break;
    case TX_32X32: get_txb_ctx_32x32(plane_bsize, plane, a, l, txb_ctx); break;
    default:
      get_txb_ctx_general(plane_bsize, tx_size, plane, a, l, txb_ctx);
      break;
  }
}